

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

bool __thiscall Js::FunctionBody::NeedEnsureDynamicProfileInfo(FunctionBody *this)

{
  bool bVar1;
  bool local_11;
  FunctionBody *this_local;
  
  local_11 = false;
  if ((*(uint *)&this->field_0x178 >> 0x1d & 1) == 0) {
    bVar1 = HasExecutionDynamicProfileInfo(this);
    local_11 = false;
    if (!bVar1) {
      local_11 = DynamicProfileInfo::IsEnabled(this);
    }
  }
  return local_11;
}

Assistant:

bool FunctionBody::NeedEnsureDynamicProfileInfo() const
    {
        // Only need to ensure dynamic profile if we don't already have link up the dynamic profile info
        // and dynamic profile collection is enabled
        return
            !this->m_isFromNativeCodeModule &&
            !this->HasExecutionDynamicProfileInfo() &&
            DynamicProfileInfo::IsEnabled(this);
    }